

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O0

void __thiscall
slang::TimeTrace::Profiler::begin
          (Profiler *this,string *name,
          function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          detail)

{
  Entry *this_00;
  value_type *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  
  this_00 = (Entry *)stack();
  std::chrono::_V2::steady_clock::now();
  std::this_thread::get_id();
  std::__cxx11::string::string(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator()((function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_ffffffffffffff58);
  std::vector<slang::Entry,_std::allocator<slang::Entry>_>::push_back
            ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)this_00,
             in_stack_ffffffffffffff58);
  Entry::~Entry(this_00);
  return;
}

Assistant:

void begin(std::string name, function_ref<std::string()> detail) {
        stack.push_back(
            Entry{steady_clock::now(), {}, std::this_thread::get_id(), std::move(name), detail()});
    }